

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgest.cpp
# Opt level: O0

void Gesture1_Do_proc(Am_Object *cmd)

{
  byte bVar1;
  Am_Value *pAVar2;
  void *this;
  ostream *poVar3;
  double dVar4;
  undefined1 local_28 [8];
  Am_Value v;
  Am_Object inter;
  Am_Object *cmd_local;
  
  Am_Object::Get_Owner((Am_Object *)&v.value.bool_value,(Am_Slot_Flags)cmd);
  Am_Value::Am_Value((Am_Value *)local_28);
  pAVar2 = Am_Object::Peek(cmd,0x169,0);
  Am_Value::operator=((Am_Value *)local_28,(Am_Value *)pAVar2);
  bVar1 = Am_Value::Valid();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"** UNRECOGNIZED");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"** Recognized: ");
    this = (void *)operator<<(poVar3,(Am_Value *)local_28);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"(nap = ");
  pAVar2 = (Am_Value *)Am_Object::Get((short)&v + 8,0x141);
  dVar4 = Am_Value::operator_cast_to_double(pAVar2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar4);
  poVar3 = std::operator<<(poVar3,", dist=");
  pAVar2 = (Am_Value *)Am_Object::Get((short)&v + 8,0x142);
  dVar4 = Am_Value::operator_cast_to_double(pAVar2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar4);
  poVar3 = std::operator<<(poVar3,")");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Am_Value::~Am_Value((Am_Value *)local_28);
  Am_Object::~Am_Object((Am_Object *)&v.value.bool_value);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Gesture1_Do, (Am_Object cmd))
{
  Am_Object inter = cmd.Get_Owner();
  Am_Value v;

  v = cmd.Peek(Am_VALUE);
  if (v.Valid())
    cout << "** Recognized: " << v << endl;
  else
    cout << "** UNRECOGNIZED" << endl;

  cout << "(nap = " << (double)inter.Get(Am_NONAMBIGUITY_PROB)
       << ", dist=" << (double)inter.Get(Am_DIST_TO_MEAN) << ")" << endl;
}